

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCrypto_openssl.cc
# Opt level: O0

void bad_bits(int bits)

{
  logic_error *this;
  string local_88;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  int local_c;
  int bits_local;
  
  local_c = bits;
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"unsupported key length: ",&local_51);
  std::__cxx11::to_string(&local_88,local_c);
  std::operator+(&local_30,&local_50,&local_88);
  std::logic_error::logic_error(this,(string *)&local_30);
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static void
bad_bits(int bits)
{
    throw std::logic_error(std::string("unsupported key length: ") + std::to_string(bits));
}